

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateID.h
# Opt level: O0

void __thiscall DIS::AggregateID::AggregateID(AggregateID *this,AggregateID *param_1)

{
  unsigned_short uVar1;
  AggregateID *param_1_local;
  AggregateID *this_local;
  
  this->_vptr_AggregateID = (_func_int **)&PTR__AggregateID_00271328;
  uVar1 = param_1->_application;
  this->_site = param_1->_site;
  this->_application = uVar1;
  this->_aggregateID = param_1->_aggregateID;
  return;
}

Assistant:

class OPENDIS6_EXPORT AggregateID
{
protected:
  /** The site ID */
  unsigned short _site; 

  /** The application ID */
  unsigned short _application; 

  /** the aggregate ID */
  unsigned short _aggregateID; 


 public:
    AggregateID();
    virtual ~AggregateID();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getSite() const; 
    void setSite(unsigned short pX); 

    unsigned short getApplication() const; 
    void setApplication(unsigned short pX); 

    unsigned short getAggregateID() const; 
    void setAggregateID(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const AggregateID& rhs) const;
}